

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O1

ion_err_t oafh_find_item_loc(ion_file_hashmap_t *hash_map,ion_key_t key,int *location)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  char *__ptr;
  uint uVar5;
  ulong uVar6;
  ion_err_t iVar7;
  size_t __size;
  int iVar8;
  
  iVar4 = (*hash_map->compute_hash)(hash_map,key,(hash_map->super).record.key_size);
  uVar2 = (long)iVar4 % (long)hash_map->map_size;
  uVar6 = uVar2 & 0xffffffff;
  iVar4 = (hash_map->super).record.key_size;
  iVar1 = (hash_map->super).record.value_size;
  __size = (long)iVar4 + (long)iVar1 + 1;
  __ptr = (char *)malloc(__size);
  iVar8 = 0;
  fseek((FILE *)hash_map->file,(long)((int)__size * (int)uVar2),0);
  iVar7 = '\x01';
  if (hash_map->map_size != 0) {
    do {
      fread(__ptr,1,1,(FILE *)hash_map->file);
      fread(__ptr + 1,(long)(iVar1 + iVar4),1,(FILE *)hash_map->file);
      if (*__ptr != -2) {
        if (*__ptr == -1) break;
        cVar3 = (*(hash_map->super).compare)(__ptr + 1,key,(hash_map->super).record.key_size);
        if (cVar3 == '\0') {
          *location = (int)uVar6;
          iVar7 = '\0';
          goto LAB_00108f91;
        }
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
      if (hash_map->map_size <= (int)uVar5) {
        rewind((FILE *)hash_map->file);
        uVar6 = 0;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != hash_map->map_size);
    iVar7 = '\x01';
  }
LAB_00108f91:
  free(__ptr);
  return iVar7;
}

Assistant:

ion_err_t
oafh_find_item_loc(
	ion_file_hashmap_t	*hash_map,
	ion_key_t			key,
	int					*location
) {
	ion_hash_t hash = hash_map->compute_hash(hash_map, key, hash_map->super.record.key_size);
	/* compute hash value for given key */

	int loc			= oafh_get_location(hash, hash_map->map_size);
	/* determine bucket based on hash */

	int count		= 0;

	ion_hash_bucket_t *item;

	int record_size = hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS);

	item = malloc(record_size);

	/* set file position */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	/* needs to traverse file again */
	while (count != hash_map->map_size) {
		fread(&item->status, SIZEOF(STATUS), 1, hash_map->file);
		fread(item->data, record_size - SIZEOF(STATUS), 1, hash_map->file);

		if (item->status == ION_EMPTY) {
			free(item);
			return err_item_not_found;	/* if you hit an empty cell, exit */
		}
		else {
			/* calculate if there is a match */

			if (item->status != ION_DELETED) {
				int key_is_equal = hash_map->super.compare(item->data, key, hash_map->super.record.key_size);

				if (ION_IS_EQUAL == key_is_equal) {
					(*location) = loc;
					free(item);
					return err_ok;
				}
			}

			loc++;
			count++;

			if (loc >= hash_map->map_size) {
				/* Perform wrapping */
				loc = 0;
				frewind(hash_map->file);
			}
		}
	}

	free(item);
	return err_item_not_found;	/* key have not been found */
}